

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_widget_text_wrap(nk_command_buffer *o,nk_rect b,char *string,int len,nk_text *t,
                        nk_user_font *f)

{
  float fVar1;
  nk_rect b_00;
  float fVar2;
  float local_80;
  float local_7c;
  undefined1 local_70 [8];
  nk_text text;
  nk_rect line;
  int done;
  int fitting;
  int glyphs;
  float width;
  nk_user_font *f_local;
  nk_text *t_local;
  char *pcStack_28;
  int len_local;
  char *string_local;
  nk_command_buffer *o_local;
  nk_rect b_local;
  
  b_local._0_8_ = b._8_8_;
  o_local = b._0_8_;
  done = 0;
  line.w = 0.0;
  _glyphs = f;
  f_local = (nk_user_font *)t;
  t_local._4_4_ = len;
  pcStack_28 = string;
  string_local = (char *)o;
  if (o == (nk_command_buffer *)0x0) {
    __assert_fail("o",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4b74,
                  "void nk_widget_text_wrap(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, const struct nk_user_font *)"
                 );
  }
  if (t != (nk_text *)0x0) {
    if ((o != (nk_command_buffer *)0x0) && (t != (nk_text *)0x0)) {
      local_70 = (undefined1  [8])nk_vec2(0.0,0.0);
      text.padding.x = f_local->height;
      text.padding.y = *(float *)&f_local->field_0xc;
      if (*(float *)&f_local->userdata * 2.0 <= b_local.x) {
        local_7c = b_local.x;
      }
      else {
        local_7c = *(float *)&f_local->userdata * 2.0;
      }
      if (*(float *)((long)&f_local->userdata + 4) * 2.0 <= b_local.y) {
        local_80 = b_local.y;
      }
      else {
        local_80 = *(float *)((long)&f_local->userdata + 4) * 2.0;
      }
      fVar2 = *(float *)((long)&f_local->userdata + 4);
      b_local.y = local_80 - (fVar2 + fVar2);
      b_local.x = local_7c;
      text.background = (nk_color)(o_local._0_4_ + *(float *)&f_local->userdata);
      text.text = (nk_color)(o_local._4_4_ + *(float *)((long)&f_local->userdata + 4));
      local_7c = local_7c - (*(float *)&f_local->userdata + *(float *)&f_local->userdata);
      fVar2 = *(float *)((long)&f_local->userdata + 4);
      fVar2 = fVar2 + fVar2 + _glyphs->height;
      line.h = (float)nk_text_clamp(_glyphs,pcStack_28,t_local._4_4_,local_7c,&done,
                                    (float *)&fitting,nk_widget_text_wrap::seperator,1);
      while (((int)line.w < t_local._4_4_ && (line.h != 0.0))) {
        if (o_local._4_4_ + b_local.y <= (float)text.text + fVar2) {
          return;
        }
        b_00.y = (float)text.text;
        b_00.x = (float)text.background;
        b_00.w = local_7c;
        b_00.h = fVar2;
        nk_widget_text((nk_command_buffer *)string_local,b_00,pcStack_28 + (int)line.w,(int)line.h,
                       (nk_text *)local_70,0x11,_glyphs);
        line.w = (float)((int)line.h + (int)line.w);
        fVar1 = *(float *)((long)&f_local->userdata + 4);
        text.text = (nk_color)(fVar1 + fVar1 + _glyphs->height + (float)text.text);
        line.h = (float)nk_text_clamp(_glyphs,pcStack_28 + (int)line.w,t_local._4_4_ - (int)line.w,
                                      local_7c,&done,(float *)&fitting,
                                      nk_widget_text_wrap::seperator,1);
      }
    }
    return;
  }
  __assert_fail("t",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4b75,
                "void nk_widget_text_wrap(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB void
nk_widget_text_wrap(struct nk_command_buffer *o, struct nk_rect b,
    const char *string, int len, const struct nk_text *t,
    const struct nk_user_font *f)
{
    float width;
    int glyphs = 0;
    int fitting = 0;
    int done = 0;
    struct nk_rect line;
    struct nk_text text;
    NK_INTERN nk_rune seperator[] = {' '};

    NK_ASSERT(o);
    NK_ASSERT(t);
    if (!o || !t) return;

    text.padding = nk_vec2(0,0);
    text.background = t->background;
    text.text = t->text;

    b.w = NK_MAX(b.w, 2 * t->padding.x);
    b.h = NK_MAX(b.h, 2 * t->padding.y);
    b.h = b.h - 2 * t->padding.y;

    line.x = b.x + t->padding.x;
    line.y = b.y + t->padding.y;
    line.w = b.w - 2 * t->padding.x;
    line.h = 2 * t->padding.y + f->height;

    fitting = nk_text_clamp(f, string, len, line.w, &glyphs, &width, seperator,NK_LEN(seperator));
    while (done < len) {
        if (!fitting || line.y + line.h >= (b.y + b.h)) break;
        nk_widget_text(o, line, &string[done], fitting, &text, NK_TEXT_LEFT, f);
        done += fitting;
        line.y += f->height + 2 * t->padding.y;
        fitting = nk_text_clamp(f, &string[done], len - done, line.w, &glyphs, &width, seperator,NK_LEN(seperator));
    }
}